

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O2

QSslConfiguration __thiscall QNetworkAccessBackend::sslConfiguration(QNetworkAccessBackend *this)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RSI[1] + 0x7c) & 1) != 0) {
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_20 = "default";
    (**(code **)*in_RSI)();
    uVar1 = QMetaObject::className();
    QMessageLogger::warning
              (local_38,"Backend (%s) claiming to use TLS hasn\'t overridden sslConfiguration.",
               uVar1);
  }
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QNetworkAccessBackend::sslConfiguration() const
{
    if (securityFeatures() & SecurityFeature::TLS) {
        qWarning("Backend (%s) claiming to use TLS hasn't overridden sslConfiguration.",
                 metaObject()->className());
    }
    return {};
}